

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main_dymon_pbm.cpp
# Opt level: O0

int main(int argc,char **argv)

{
  char *name;
  char *string;
  bool bVar1;
  arg_lit *paVar2;
  arg_lit *paVar3;
  arg_str *paVar4;
  arg_str *paVar5;
  arg_int *paVar6;
  arg_int *paVar7;
  arg_lit *paVar8;
  arg_file *paVar9;
  ostream *poVar10;
  cJSON *item;
  int local_12c;
  int local_114;
  int local_108;
  int i;
  int copies;
  int error;
  Dymon *local_f0;
  Dymon *dymon;
  int model;
  char *dev;
  cJSON *json;
  char *ip;
  cJSON *pcStack_c0;
  bool lw450;
  char *path;
  anon_enum_32 interfaze;
  char *bitmapFile;
  void *argtable [9];
  arg_end *argEnd;
  arg_lit *argDebug;
  arg_file *argInput;
  arg_int *argCopies;
  arg_int *argModel;
  arg_str *argNet;
  arg_str *argUsb;
  arg_lit *argVersion;
  arg_lit *argHelp;
  char **argv_local;
  int argc_local;
  
  paVar2 = arg_lit0((char *)0x0,"help","Print help and exit");
  bitmapFile = (char *)paVar2;
  paVar3 = arg_lit0((char *)0x0,"version","Print version and exit");
  argtable[0] = paVar3;
  paVar4 = arg_str0((char *)0x0,"usb","<DEVICE>","Use USB printer device (e.g. \'/dev/usb/lp1\')");
  argtable[1] = paVar4;
  paVar5 = arg_str0((char *)0x0,"net","<IP>","Use network printer with IP (e.g. \'192.168.178.23\')"
                   );
  argtable[2] = paVar5;
  paVar6 = arg_int0((char *)0x0,"model","<NUMBER>","Model number of DYMO LabelWriter (e.g. \'450\')"
                   );
  argtable[3] = paVar6;
  paVar7 = arg_int0((char *)0x0,"copies","<NUMBER>","Number of copies to be printed [default: 1]");
  argtable[4] = paVar7;
  paVar8 = arg_lit0((char *)0x0,"debug","Enable debug output");
  argtable[5] = paVar8;
  paVar9 = arg_file1((char *)0x0,(char *)0x0,"<INPUT>","PBM file to be printed");
  argtable[6] = paVar9;
  argtable[7] = arg_end(3);
  argtable[8] = argtable[7];
  arg_parse(argc,argv,&bitmapFile);
  if (paVar2->count == 0) {
    if (paVar3->count == 0) {
      if ((paVar4->count == 0) || (paVar5->count == 0)) {
        if (paVar4->count == paVar5->count) {
          puts(
              "\x1b[31mError:\x1b[0m Interface specifier required (one of \'--usb\' or \'--net\')\n"
              );
          print_usage(&bitmapFile);
          argv_local._4_4_ = -1;
        }
        else if (paVar9->count == 0) {
          puts("\x1b[31mError:\x1b[0m Input file required\n");
          print_usage(&bitmapFile);
          argv_local._4_4_ = -1;
        }
        else {
          if (paVar8->count == 0) {
            dymonDebug = 1;
          }
          name = *paVar9->filename;
          bVar1 = file_exist(name);
          if (bVar1) {
            ip._7_1_ = false;
            if (paVar5->count == 0) {
              bVar1 = true;
              pcStack_c0 = (cJSON *)*paVar4->sval;
              if (paVar6->count == 0) {
                local_114 = 0;
              }
              else {
                local_114 = *paVar6->ival;
              }
              ip._7_1_ = local_114 == 0x1c2;
            }
            else {
              bVar1 = false;
              string = *paVar5->sval;
              pcStack_c0 = cJSON_CreateObject();
              item = cJSON_CreateString(string);
              cJSON_AddItemToObject(pcStack_c0,"ip",item);
            }
            if (bVar1) {
              local_f0 = (Dymon *)operator_new(0x38);
              DymonUsb::DymonUsb((DymonUsb *)local_f0,1,ip._7_1_);
            }
            else {
              local_f0 = (Dymon *)operator_new(0x38);
              DymonNet::DymonNet((DymonNet *)local_f0,1);
            }
            argv_local._4_4_ = Dymon::start(local_f0,pcStack_c0);
            if (argv_local._4_4_ == 0) {
              if (paVar7->count == 0) {
                local_12c = 1;
              }
              else {
                local_12c = *paVar7->ival;
              }
              for (local_108 = 0; local_108 < local_12c; local_108 = local_108 + 1) {
                Dymon::print_bitmap(local_f0,name,(uint)(local_108 + 1 < local_12c));
              }
              Dymon::end(local_f0);
            }
            if (local_f0 != (Dymon *)0x0) {
              operator_delete(local_f0,0x38);
            }
          }
          else {
            poVar10 = std::operator<<((ostream *)&std::cout,"\x1b[31mError:\x1b[0m File \'");
            poVar10 = std::operator<<(poVar10,name);
            poVar10 = std::operator<<(poVar10,"\' does not exist");
            std::ostream::operator<<(poVar10,std::endl<char,std::char_traits<char>>);
            argv_local._4_4_ = -4;
          }
        }
      }
      else {
        puts("\x1b[31mError:\x1b[0m Only one interface allowed (one of \'--usb\' or \'--net\')\n");
        print_usage(&bitmapFile);
        argv_local._4_4_ = -1;
      }
    }
    else {
      puts("2.0.0");
      argv_local._4_4_ = 0;
    }
  }
  else {
    print_help(&bitmapFile);
    argv_local._4_4_ = 0;
  }
  return argv_local._4_4_;
}

Assistant:

int main(int argc, char * argv[])
{
   struct arg_lit * argHelp;
   struct arg_lit * argVersion;
   struct arg_str * argUsb;
   struct arg_str * argNet;
   struct arg_int * argModel;
   struct arg_int * argCopies;
   struct arg_file * argInput;
   struct arg_lit * argDebug;
   struct arg_end * argEnd;
   void * argtable[] =
   {
      argHelp = arg_lit0(NULL, "help", "Print help and exit"),
      argVersion = arg_lit0(NULL, "version", "Print version and exit"),
   #ifdef _WIN32
      argUsb = arg_str0(NULL, "usb", "<ID>", "Use USB printer with vid/pid ID (e.g. 'vid_0922')"),
   #else
      argUsb = arg_str0(NULL, "usb", "<DEVICE>", "Use USB printer device (e.g. '/dev/usb/lp1')"),
   #endif
      argNet = arg_str0(NULL, "net", "<IP>", "Use network printer with IP (e.g. '192.168.178.23')"),
      argModel = arg_int0(NULL, "model", "<NUMBER>", "Model number of DYMO LabelWriter (e.g. '450')"),
      argCopies = arg_int0(NULL, "copies", "<NUMBER>", "Number of copies to be printed [default: 1]"),
      argDebug = arg_lit0(NULL, "debug", "Enable debug output"),
      argInput = arg_file1(NULL, NULL, "<INPUT>", "PBM file to be printed"),
      argEnd = arg_end(3),
   };

   // Parse command line arguments.
   arg_parse(argc, argv, argtable);

   // Help
   if (argHelp->count)
   {
      print_help(argtable);
      return 0;
   }

   // Version
   if (argVersion->count)
   {
      puts(APP_VERSION);
      return 0;
   }

   // Check existance of one (and only one) of the supported interfaces
   if (argUsb->count && argNet->count)
   {
      puts(VT100_RED "Error:" VT100_RESET " Only one interface allowed (one of '--usb' or '--net')\n");
      print_usage(argtable);
      return -1;
   }
   if ((argUsb->count ^ argNet->count) == 0)
   {
      puts(VT100_RED "Error:" VT100_RESET " Interface specifier required (one of '--usb' or '--net')\n");
      print_usage(argtable);
      return -1;
   }

   // Check for input file / pbm
   if (!argInput->count)
   {
      puts(VT100_RED "Error:" VT100_RESET " Input file required\n");
      print_usage(argtable);
      return -1;
   }

   // Check for debug switch
   if (!argDebug->count)
   {
      dymonDebug = 1;
   }

   //check if inpuzt file exists
   const char * const bitmapFile = argInput->filename[0];
   if (!file_exist(bitmapFile))
   {
      cout << VT100_RED "Error:" VT100_RESET " File '" << bitmapFile << "' does not exist" << endl;
      return -4;
   }


   enum {
      NET = 0,
      USB
   } interfaze;
   const char * path;
   bool lw450 = false;

   //get interface and path
   if (argNet->count)
   {
      interfaze = NET;
      const char * const ip = argNet->sval[0];
      cJSON * json = cJSON_CreateObject();
      cJSON_AddItemToObject(json, "ip", cJSON_CreateString(ip)); //wrap the ip address into a json object
      path = (char *)json; //pass this to DymonNet::start, which expects a json object
   }
   else //if (argUsb->count)
   {
      interfaze = USB;
      const char * const dev = argUsb->sval[0];
      const int model = (argModel->count ? argModel->ival[0] : 0);
      lw450 = (model == 450);
   #ifdef _WIN32
      //get the device name, to be used on windows
      //
      static char devname[256];
      int err = usbprint_get_devicename(devname, sizeof(devname), dev); //input something like "vid_0922" and get device name like "\\?\usb#vid_0922&pid_0028#04133046018600#{28d78fad-5a12-11d1-ae5b-0000f803a8c2}"
      if (err != 0)
      {
         cout << "Can't find any USB connected DYMO" << endl;
         return -2;
      }
      path = devname;
   #else
      path = dev;
   #endif
   }


   // Create instance
   Dymon * dymon;
   if (interfaze == NET)
   {
      dymon = new DymonNet;
   }
   else //interfaze == USB
   {
      dymon = new DymonUsb(1, lw450);
   }

   // Print label
   int error = dymon->start((void *)path); //connect to labelwriter
   if (error == 0)
   {
      const int copies = (argCopies->count ? argCopies->ival[0] : 1);
      for (int i = 0; i < copies; ++i) 
      {
         dymon->print_bitmap(bitmapFile, ((i+1) < copies));
      }
      dymon->end(); //finalize printing (form-feed) and close socket
   }

   // Clean up
   delete dymon;
   return error;
}